

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall
Bstrlib::CBString::operator+(CBString *__return_storage_ptr__,CBString *this,CBString *b)

{
  CBString(__return_storage_ptr__,this);
  operator+=(__return_storage_ptr__,b);
  return __return_storage_ptr__;
}

Assistant:

const CBString CBString::operator + (const CBString& b) const {
	CBString retval (*this);
	retval += b;
	return retval;
}